

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QRect __thiscall
QMainWindowLayout::dockWidgetAreaRect
          (QMainWindowLayout *this,DockWidgetArea area,DockWidgetAreaSize size)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  DockPosition dockPos;
  QLoggingCategory *pQVar6;
  QDebug *pQVar7;
  long in_FS_OFFSET;
  QRect QVar8;
  QDebug QStack_268;
  QDebug local_260;
  undefined1 local_258 [8];
  QDockAreaLayout dl;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  dockPos = toDockPos(area);
  if (dockPos == DockCount) {
    pQVar6 = QtPrivateLogging::lcQpaDockWidgets();
    if (((pQVar6->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      dl.rect._8_8_ = pQVar6->name;
      dl.corners[0] = RightDockWidgetArea;
      dl.corners[1] = NoDockWidgetArea;
      dl.corners[2] = NoDockWidgetArea;
      dl.corners[3] = NoDockWidgetArea;
      dl.rect.x1.m_i = 0;
      dl.rect.y1.m_i = 0;
      QMessageLogger::debug();
      pQVar7 = QDebug::operator<<(&QStack_268,"QMainWindowLayout::dockWidgetAreaRect called with");
      local_260.stream = pQVar7->stream;
      *(int *)(local_260.stream + 0x28) = *(int *)(local_260.stream + 0x28) + 1;
      ::operator<<((Stream *)local_258,(DockWidgetArea)&local_260);
      QDebug::~QDebug((QDebug *)local_258);
      QDebug::~QDebug(&local_260);
      QDebug::~QDebug(&QStack_268);
    }
    QVar8 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  }
  else {
    memset(&dl,0xaa,0x220);
    QDockAreaLayout::QDockAreaLayout(&dl,(QDockAreaLayout *)(this + 0x1a0));
    if (size == Maximum) {
      QVar8 = QDockAreaLayout::gapRect(&dl,dockPos);
    }
    else {
      uVar1 = dl.docks[dockPos].rect.x1;
      uVar4 = dl.docks[dockPos].rect.y1;
      QVar8.y1.m_i = uVar4;
      QVar8.x1.m_i = uVar1;
      uVar2 = dl.docks[dockPos].rect.x2;
      uVar5 = dl.docks[dockPos].rect.y2;
      QVar8.y2.m_i = uVar5;
      QVar8.x2.m_i = uVar2;
    }
    QDockAreaLayout::~QDockAreaLayout(&dl);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return QVar8;
  }
  __stack_chk_fail();
}

Assistant:

QRect QMainWindowLayout::dockWidgetAreaRect(const Qt::DockWidgetArea area, DockWidgetAreaSize size) const
{
    const QInternal::DockPosition dockPosition = toDockPos(area);

    // Called with invalid dock widget area
    if (dockPosition == QInternal::DockCount) {
        qCDebug(lcQpaDockWidgets) << "QMainWindowLayout::dockWidgetAreaRect called with" << area;
        return QRect();
    }

    const QDockAreaLayout dl = layoutState.dockAreaLayout;

    // Return maximum or visible rectangle
    return (size == Maximum) ? dl.gapRect(dockPosition) : dl.docks[dockPosition].rect;
}